

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::
Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doPrint(Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
          *this,ostream *os,BaseArgExprs *args)

{
  BaseArgExprs *os_00;
  bool bVar1;
  ostream *poVar2;
  const_reference ppEVar3;
  string local_40 [32];
  BaseArgExprs *local_20;
  BaseArgExprs *args_local;
  ostream *os_local;
  Func<vkt::shaderexecutor::Signature<float,_tcu::Vector<float,_2>,_tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_local;
  
  local_20 = args;
  args_local = (BaseArgExprs *)os;
  os_local = (ostream *)this;
  (*(this->super_FuncBase)._vptr_FuncBase[2])();
  poVar2 = std::operator<<(os,local_40);
  std::operator<<(poVar2,"(");
  std::__cxx11::string::~string(local_40);
  bVar1 = isTypeValid<tcu::Vector<float,2>>();
  os_00 = args_local;
  if (bVar1) {
    ppEVar3 = std::
              vector<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
              ::operator[](local_20,0);
    shaderexecutor::operator<<((ostream *)os_00,*ppEVar3);
  }
  bVar1 = isTypeValid<tcu::Vector<float,2>>();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)args_local,", ");
    ppEVar3 = std::
              vector<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
              ::operator[](local_20,1);
    shaderexecutor::operator<<(poVar2,*ppEVar3);
  }
  bVar1 = isTypeValid<vkt::shaderexecutor::Void>();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)args_local,", ");
    ppEVar3 = std::
              vector<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
              ::operator[](local_20,2);
    shaderexecutor::operator<<(poVar2,*ppEVar3);
  }
  bVar1 = isTypeValid<vkt::shaderexecutor::Void>();
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)args_local,", ");
    ppEVar3 = std::
              vector<const_vkt::shaderexecutor::ExprBase_*,_std::allocator<const_vkt::shaderexecutor::ExprBase_*>_>
              ::operator[](local_20,3);
    shaderexecutor::operator<<(poVar2,*ppEVar3);
  }
  std::operator<<((ostream *)args_local,")");
  return;
}

Assistant:

virtual void		doPrint			(ostream& os, const BaseArgExprs& args)	const
	{
		os << getName() << "(";

		if (isTypeValid<Arg0>())
			os << *args[0];

		if (isTypeValid<Arg1>())
			os << ", " << *args[1];

		if (isTypeValid<Arg2>())
			os << ", " << *args[2];

		if (isTypeValid<Arg3>())
			os << ", " << *args[3];

		os << ")";
	}